

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aom_codec.c
# Opt level: O0

aom_codec_err_t aom_codec_destroy(aom_codec_ctx_t *ctx)

{
  undefined8 *in_RDI;
  aom_codec_err_t local_4;
  
  if (in_RDI == (undefined8 *)0x0) {
    local_4 = AOM_CODEC_INVALID_PARAM;
  }
  else if ((in_RDI[1] == 0) || (in_RDI[6] == 0)) {
    *(undefined4 *)(in_RDI + 2) = 1;
    local_4 = AOM_CODEC_ERROR;
  }
  else {
    (**(code **)(in_RDI[1] + 0x20))(in_RDI[6]);
    in_RDI[1] = 0;
    *in_RDI = 0;
    in_RDI[6] = 0;
    *(undefined4 *)(in_RDI + 2) = 0;
    local_4 = AOM_CODEC_OK;
  }
  return local_4;
}

Assistant:

aom_codec_err_t aom_codec_destroy(aom_codec_ctx_t *ctx) {
  if (!ctx) {
    return AOM_CODEC_INVALID_PARAM;
  }
  if (!ctx->iface || !ctx->priv) {
    ctx->err = AOM_CODEC_ERROR;
    return AOM_CODEC_ERROR;
  }
  ctx->iface->destroy((aom_codec_alg_priv_t *)ctx->priv);
  ctx->iface = NULL;
  ctx->name = NULL;
  ctx->priv = NULL;
  ctx->err = AOM_CODEC_OK;
  return AOM_CODEC_OK;
}